

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_InSetIgnoreCase_Test::TestBody(TApp_InSetIgnoreCase_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertHelper local_130;
  AssertHelper local_128;
  allocator local_11d;
  allocator_type local_11c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11b;
  allocator local_11a;
  allocator local_119;
  AssertionResult gtest_ar;
  string local_f8 [32];
  string local_d8 [32];
  string choice;
  string local_98;
  string local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  choice._M_dataplus._M_p = (pointer)&choice.field_2;
  choice._M_string_length = 0;
  choice.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_78,"-q,--quick",(allocator *)&local_130);
  std::__cxx11::string::string((string *)&gtest_ar,"one",(allocator *)&local_128);
  std::__cxx11::string::string(local_f8,"Two",&local_119);
  std::__cxx11::string::string(local_d8,"THREE",&local_11a);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_58,__l,&local_11b,&local_11c);
  pcVar3 = "";
  std::__cxx11::string::string((string *)&local_98,"",&local_11d);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_set_ignore_case
            (this_00,&local_78,&choice,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_58);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick",(allocator *)&local_130);
  std::__cxx11::string::string(local_f8,"One",(allocator *)&local_128);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"one\"","choice",(char (*) [4])0x1588e8,&choice);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x373,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick",(allocator *)&local_130);
  std::__cxx11::string::string(local_f8,"two",(allocator *)&local_128);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Two\"","choice",(char (*) [4])"Two",&choice);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x378,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick",(allocator *)&local_130);
  std::__cxx11::string::string(local_f8,"ThrEE",(allocator *)&local_128);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"THREE\"","choice",(char (*) [6])"THREE",&choice);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x37d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick",(allocator *)&local_130);
  std::__cxx11::string::string(local_f8,"four",(allocator *)&local_128);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x381,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_130,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"--quick=one",(allocator *)&local_130);
  std::__cxx11::string::string(local_f8,"--quick=two",(allocator *)&local_128);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_d8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x385,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_130,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  std::__cxx11::string::~string((string *)&choice);
  return;
}

Assistant:

TEST_F(TApp, InSetIgnoreCase) {

    std::string choice;
    app.add_set_ignore_case("-q,--quick", choice, {"one", "Two", "THREE"});

    args = {"--quick", "One"};
    run();
    EXPECT_EQ("one", choice);

    app.reset();
    args = {"--quick", "two"};
    run();
    EXPECT_EQ("Two", choice); // Keeps caps from set

    app.reset();
    args = {"--quick", "ThrEE"};
    run();
    EXPECT_EQ("THREE", choice); // Keeps caps from set

    app.reset();
    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);

    app.reset();
    args = {"--quick=one", "--quick=two"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}